

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManLogAigStats(Gia_Man_t *p,char *pDumpFile)

{
  uint uVar1;
  FILE *__s;
  
  __s = fopen(pDumpFile,"wb");
  fwrite("{\n",2,1,__s);
  fprintf(__s,"    \"name\" : \"%s\",\n",p->pName);
  fprintf(__s,"    \"input\" : %d,\n",(ulong)(uint)p->vCis->nSize);
  fprintf(__s,"    \"output\" : %d,\n",(ulong)(uint)p->vCos->nSize);
  uVar1 = Gia_ManAndNum(p);
  fprintf(__s,"    \"and\" : %d,\n",(ulong)uVar1);
  uVar1 = Gia_ManLevelNum(p);
  fprintf(__s,"    \"level\" : %d\n",(ulong)uVar1);
  fwrite("}\n",2,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Gia_ManLogAigStats( Gia_Man_t * p, char * pDumpFile )
{
    FILE * pTable = fopen( pDumpFile, "wb" );
    fprintf( pTable, "{\n" );
    fprintf( pTable, "    \"name\" : \"%s\",\n", p->pName );
    fprintf( pTable, "    \"input\" : %d,\n",    Gia_ManCiNum(p) );
    fprintf( pTable, "    \"output\" : %d,\n",   Gia_ManCoNum(p) );
    fprintf( pTable, "    \"and\" : %d,\n",      Gia_ManAndNum(p) );
    fprintf( pTable, "    \"level\" : %d\n",     Gia_ManLevelNum(p) );
    fprintf( pTable, "}\n" );
    fclose( pTable );
}